

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

bool __thiscall UnifiedRegex::CharSet<char16_t>::Get_helper(CharSet<char16_t> *this,uint k)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  CharSetLeaf *leaf;
  uint i;
  CharSetInner *inner;
  undefined8 *puStack_28;
  int level;
  CharSetNode *curr;
  uint k_local;
  CharSet<char16_t> *this_local;
  
  bVar2 = IsCompact(this);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x511,"(!IsCompact())","!IsCompact()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  puStack_28 = (undefined8 *)(this->rep).compact.countPlusOne;
  inner._4_4_ = 2;
  while( true ) {
    if ((int)inner._4_4_ < 1) {
      if (puStack_28 == &CharSetFull::Instance) {
        this_local._7_1_ = true;
      }
      else {
        uVar3 = CharSetNode::leafIdx(k);
        this_local._7_1_ = CharBitvec::Get((CharBitvec *)(puStack_28 + 1),uVar3);
      }
      return this_local._7_1_;
    }
    if (puStack_28 == &CharSetFull::Instance) break;
    uVar3 = CharSetNode::innerIdx(inner._4_4_,k);
    if (puStack_28[(ulong)uVar3 + 1] == 0) {
      return false;
    }
    puStack_28 = (undefined8 *)puStack_28[(ulong)uVar3 + 1];
    inner._4_4_ = inner._4_4_ - 1;
  }
  return true;
}

Assistant:

bool CharSet<char16>::Get_helper(uint k) const
    {
        Assert(!IsCompact());
        CharSetNode* curr = rep.full.root;
        for (int level = CharSetNode::levels - 1; level > 0; level--)
        {
            if (curr == CharSetFull::TheFullNode)
                return true;
            CharSetInner* inner = (CharSetInner*)curr;
            uint i = CharSetNode::innerIdx(level, k);
            if (inner->children[i] == 0)
                return false;
            else
                curr = inner->children[i];
        }
        if (curr == CharSetFull::TheFullNode)
            return true;
        CharSetLeaf* leaf = (CharSetLeaf*)curr;
        return leaf->vec.Get(CharSetNode::leafIdx(k));
    }